

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.h
# Opt level: O2

void TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse_Emit<(TTD::NSLogEvents::EventKind)54,1ul>
               (EventLogEntry *evt,FileWriter *writer,ThreadContext *threadContext)

{
  JsRTVarsArgumentAction_InternalUse<1UL> *pJVar1;
  
  pJVar1 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)54>
                     (evt);
  (*writer->_vptr_FileWriter[3])(writer,0x12,1);
  NSSnapValues::EmitTTDVar(pJVar1->Result,writer,NoSeparator);
  NSSnapValues::EmitTTDVar(pJVar1->VarArray[0],writer,CommaSeparator);
  return;
}

Assistant:

void JsRTVarsArgumentAction_InternalUse_Emit(const EventLogEntry* evt, FileWriter* writer, ThreadContext* threadContext)
        {
            const JsRTVarsArgumentAction_InternalUse<count>* vAction = GetInlineEventDataAs<JsRTVarsArgumentAction_InternalUse<count>, tag>(evt);

            writer->WriteKey(NSTokens::Key::argRetVal, NSTokens::Separator::CommaSeparator);
            NSSnapValues::EmitTTDVar(vAction->Result, writer, NSTokens::Separator::NoSeparator);

            if(count == 1)
            {
                NSSnapValues::EmitTTDVar(vAction->VarArray[0], writer, NSTokens::Separator::CommaSeparator);
            }
            else
            {
                writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
                for(size_t i = 0; i < count; ++i)
                {
                    NSSnapValues::EmitTTDVar(vAction->VarArray[i], writer, i != 0 ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator);
                }
                writer->WriteSequenceEnd();
            }
        }